

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O0

int AF_A_FlyBuzz(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *pAVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  bool local_be;
  bool local_bb;
  FSoundID local_b8;
  int local_b4;
  int zrand;
  DVector3 local_a0;
  undefined1 local_88 [32];
  undefined1 local_68 [12];
  TFlags<ActorFlag,_unsigned_int> local_5c;
  AActor *local_58;
  AActor *targ;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = (AActor *)ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                  ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_bb = true;
    if (stateowner != (AActor *)0x0) {
      local_bb = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_bb == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                    ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                      ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_be = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_be = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_be == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                      ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                      ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      targ = (AActor *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      targ = (AActor *)0x0;
    }
    local_58 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
    bVar4 = true;
    if (local_58 != (AActor *)0x0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_5c,
                 (int)local_58 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
      bVar4 = true;
      if (uVar2 != 0) {
        iVar3 = FRandom::operator()(&pr_fly);
        bVar4 = iVar3 < 5;
      }
    }
    if (bVar4) {
      AActor::SetIdle(stateowner,false);
    }
    else {
      AActor::AngleTo((AActor *)local_68,stateowner,SUB81(local_58,0));
      TAngle<double>::operator=(&(stateowner->Angles).Yaw,(TAngle<double> *)local_68);
      pAVar1 = stateowner;
      stateowner->args[0] = stateowner->args[0] + 1;
      AActor::Pos(&local_a0,stateowner);
      TVector3<double>::XY((TVector3<double> *)local_88);
      TAngle<double>::ToVector((TAngle<double> *)&stack0xffffffffffffff50,6.0);
      TVector2<double>::operator+
                ((TVector2<double> *)(local_88 + 0x10),(TVector2<double> *)local_88);
      bVar4 = P_TryMove(pAVar1,(DVector2 *)(local_88 + 0x10),1,(secplane_t *)0x0);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        if ((stateowner->args[0] & 2U) != 0) {
          iVar3 = FRandom::operator()(&pr_fly);
          (stateowner->Vel).X = (double)(iVar3 + -0x80) / 512.0 + (stateowner->Vel).X;
          iVar3 = FRandom::operator()(&pr_fly);
          (stateowner->Vel).Y = (double)(iVar3 + -0x80) / 512.0 + (stateowner->Vel).Y;
        }
        local_b4 = FRandom::operator()(&pr_fly);
        dVar5 = AActor::Z(local_58);
        dVar6 = AActor::Z(stateowner);
        if ((dVar5 + 5.0 < dVar6) && (0x96 < local_b4)) {
          local_b4 = -local_b4;
        }
        (stateowner->Vel).Z = (double)local_b4 / 512.0;
        iVar3 = FRandom::operator()(&pr_fly);
        pAVar1 = stateowner;
        if (iVar3 < 0x28) {
          FSoundID::FSoundID(&local_b8,&(stateowner->ActiveSound).super_FSoundID);
          S_Sound(pAVar1,2,&local_b8,0.5,3.0);
        }
      }
      else {
        AActor::SetIdle(stateowner,true);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlyBuzz)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ = self->target;

	if (targ == NULL || !(targ->flags & MF_CORPSE) || pr_fly() < 5)
	{
		self->SetIdle();
		return 0;
	}

	self->Angles.Yaw = self->AngleTo(targ);
	self->args[0]++;
	if (!P_TryMove(self, self->Pos().XY() + self->Angles.Yaw.ToVector(6), true))
	{
		self->SetIdle(true);
		return 0;
	}
	if (self->args[0] & 2)
	{
		self->Vel.X += (pr_fly() - 128) / 512.;
		self->Vel.Y += (pr_fly() - 128) / 512.;
	}
	int zrand = pr_fly();
	if (targ->Z() + 5. < self->Z() && zrand > 150)
	{
		zrand = -zrand;
	}
	self->Vel.Z = zrand / 512.;
	if (pr_fly() < 40)
	{
		S_Sound(self, CHAN_VOICE, self->ActiveSound, 0.5f, ATTN_STATIC);
	}
	return 0;
}